

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

TSSymbol ts_language_symbol_for_name(TSLanguage *self,char *name)

{
  char **ppcVar1;
  int iVar2;
  ushort uVar3;
  TSSymbol TVar4;
  uint uVar5;
  
  iVar2 = strcmp(name,"ERROR");
  if (iVar2 == 0) {
    TVar4 = 0xffff;
  }
  else {
    uVar5 = self->alias_count + self->symbol_count;
    if (uVar5 != 0) {
      ppcVar1 = self->symbol_names;
      uVar3 = 0;
      do {
        iVar2 = strcmp(ppcVar1[uVar3],name);
        if (iVar2 == 0) {
          return uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar5);
    }
    TVar4 = 0;
  }
  return TVar4;
}

Assistant:

TSSymbol ts_language_symbol_for_name(const TSLanguage *self, const char *name) {
  if (!strcmp(name, "ERROR")) return ts_builtin_sym_error;

  uint32_t count = ts_language_symbol_count(self);
  for (TSSymbol i = 0; i < count; i++) {
    if (!strcmp(self->symbol_names[i], name)) {
      return i;
    }
  }
  return 0;
}